

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::next_word(Fl_Text_Display *this)

{
  uint uVar1;
  int iVar2;
  int pos;
  Fl_Text_Buffer *pFVar3;
  
  pos = this->mCursorPos;
  pFVar3 = this->mBuffer;
  if (pos < pFVar3->mLength) {
    do {
      uVar1 = Fl_Text_Buffer::char_at(pFVar3,pos);
      if ((uVar1 != 0x24) && (uVar1 != 0x5f)) {
        iVar2 = isspace(uVar1);
        if (iVar2 != 0) break;
        iVar2 = ispunct(uVar1);
        if (iVar2 != 0) break;
      }
      pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
      pFVar3 = this->mBuffer;
    } while (pos < pFVar3->mLength);
  }
  pFVar3 = this->mBuffer;
  if (pos < pFVar3->mLength) {
    do {
      uVar1 = Fl_Text_Buffer::char_at(pFVar3,pos);
      if ((uVar1 == 0x24) || (uVar1 == 0x5f)) break;
      iVar2 = isspace(uVar1);
      if (iVar2 == 0) {
        iVar2 = ispunct(uVar1);
        if (iVar2 == 0) break;
      }
      pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
      pFVar3 = this->mBuffer;
    } while (pos < pFVar3->mLength);
  }
  insert_position(this,pos);
  return;
}

Assistant:

void Fl_Text_Display::next_word() {
  int pos = insert_position();

  while (pos < buffer()->length() && !fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  while (pos < buffer()->length() && fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  insert_position( pos );
}